

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(short lhs,
         SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  bool bVar1;
  short sVar2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> in_SI;
  short in_DI;
  short *unaff_retaddr;
  short ret;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffe8;
  ushort in_stack_fffffffffffffff0;
  short in_stack_fffffffffffffff2;
  short sVar3;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff8;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar4;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffffe;
  
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)&stack0xfffffffffffffff8);
  rhs_00.m_int = in_SI.m_int;
  bVar1 = DivisionCornerCaseHelper<short,_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    (in_DI,in_SI,
                     (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xfffffffffffffff8);
  if ((!bVar1) &&
     (SVar4.m_int = rhs_00.m_int,
     bVar1 = DivisionCornerCaseHelper2<short,_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
             ::DivisionCornerCase2(in_stack_fffffffffffffff2,rhs_00,in_stack_ffffffffffffffe8),
     !bVar1)) {
    sVar3 = 0;
    sVar2 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_SI.m_int,
                                   CONCAT24(rhs_00.m_int,(uint)in_stack_fffffffffffffff0)));
    DivisionHelper<short,short,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (unaff_retaddr,
               (short *)CONCAT26(in_stack_fffffffffffffffe.m_int,
                                 CONCAT24(SVar4.m_int,
                                          CONCAT22(in_DI,in_stack_fffffffffffffff8.m_int))),
               (short *)CONCAT26(in_SI.m_int,CONCAT24(rhs_00.m_int,CONCAT22(sVar3,sVar2))));
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)&stack0xfffffffffffffffe,(short *)&stack0xfffffffffffffff2);
    in_stack_fffffffffffffff8.m_int = in_stack_fffffffffffffffe.m_int;
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         in_stack_fffffffffffffff8.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}